

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

completion * __thiscall
mjs::interpreter::impl::operator()(completion *__return_storage_ptr__,impl *this,for_statement *s)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  expression *peVar3;
  statement *s_00;
  impl *ctx;
  bool local_1d9;
  value local_1b0;
  value local_188;
  undefined4 local_15c;
  completion local_158;
  byte local_112;
  byte local_111;
  value local_110;
  value local_e8;
  undefined1 local_b9;
  value local_b8;
  undefined1 local_80 [8];
  completion c_1;
  statement *is;
  label_set ls;
  for_statement *s_local;
  impl *this_local;
  completion *c;
  
  ctx = this;
  ls.
  super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)s;
  get_labels((label_set *)&is,this,&s->super_statement);
  iVar2 = for_statement::init((for_statement *)
                              ls.
                              super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,(EVP_PKEY_CTX *)ctx
                             );
  c_1.target._M_str = (wchar_t *)CONCAT44(extraout_var,iVar2);
  if ((statement *)c_1.target._M_str != (statement *)0x0) {
    eval((completion *)local_80,this,(statement *)c_1.target._M_str);
    bVar1 = completion::operator_cast_to_bool((completion *)local_80);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      __assert_fail("!c",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/interpreter.cpp"
                    ,0x3bf,"completion mjs::interpreter::impl::operator()(const for_statement &)");
    }
    get_value(&local_b8,this,(value *)&c_1);
    value::~value(&local_b8);
    completion::~completion((completion *)local_80);
  }
  local_b9 = 0;
  completion::completion(__return_storage_ptr__,(value *)value::undefined,normal);
  while( true ) {
    local_111 = 0;
    local_112 = 0;
    peVar3 = for_statement::cond((for_statement *)
                                 ls.
                                 super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_1d9 = true;
    if (peVar3 != (expression *)0x0) {
      peVar3 = for_statement::cond((for_statement *)
                                   ls.
                                   super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
      eval(&local_110,this,peVar3);
      local_111 = 1;
      get_value(&local_e8,this,&local_110);
      local_112 = 1;
      local_1d9 = to_boolean(&local_e8);
    }
    if ((local_112 & 1) != 0) {
      value::~value(&local_e8);
    }
    if ((local_111 & 1) != 0) {
      value::~value(&local_110);
    }
    if (local_1d9 == false) break;
    s_00 = for_statement::s((for_statement *)
                            ls.
                            super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
    eval(&local_158,this,s_00);
    completion::operator=(__return_storage_ptr__,&local_158);
    completion::~completion(&local_158);
    bVar1 = handle_completion(__return_storage_ptr__,(label_set *)&is);
    if (bVar1) break;
    peVar3 = for_statement::iter((for_statement *)
                                 ls.
                                 super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (peVar3 != (expression *)0x0) {
      peVar3 = for_statement::iter((for_statement *)
                                   ls.
                                   super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
      eval(&local_1b0,this,peVar3);
      get_value(&local_188,this,&local_1b0);
      value::~value(&local_188);
      value::~value(&local_1b0);
    }
  }
  local_b9 = 1;
  local_15c = 1;
  std::
  vector<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
  ::~vector((vector<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
             *)&is);
  return __return_storage_ptr__;
}

Assistant:

completion operator()(const for_statement& s) {
        const auto ls = get_labels(s);
        if (auto is = s.init()) {
            auto c = eval(*is);
            assert(!c); // Expect normal completion
            (void)get_value(c.result);
        }
        completion c{};
        while (!s.cond() || to_boolean(get_value(eval(*s.cond())))) {
            c = eval(s.s());

            if (handle_completion(c, ls)) {
                return c;
            }

            if (s.iter()) {
                (void)get_value(eval(*s.iter()));
            }
        }
        return c;
    }